

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

dev_t archive_entry_rdev(archive_entry *entry)

{
  wchar_t wVar1;
  archive_entry *entry_local;
  
  wVar1 = archive_entry_rdev_is_set(entry);
  if (wVar1 == L'\0') {
    entry_local = (archive_entry *)0x0;
  }
  else if ((entry->ae_stat).aest_rdev_is_broken_down == L'\0') {
    entry_local = (archive_entry *)(entry->ae_stat).aest_rdev;
  }
  else {
    entry_local = (archive_entry *)
                  gnu_dev_makedev((uint)(entry->ae_stat).aest_rdevmajor,
                                  (uint)(entry->ae_stat).aest_rdevminor);
  }
  return (dev_t)entry_local;
}

Assistant:

__LA_DEV_T
archive_entry_rdev(struct archive_entry *entry)
{
	if (archive_entry_rdev_is_set(entry)) {
		if (entry->ae_stat.aest_rdev_is_broken_down)
			return ae_makedev(entry->ae_stat.aest_rdevmajor,
			    entry->ae_stat.aest_rdevminor);
		else
			return (entry->ae_stat.aest_rdev);
	} else {
		return 0;
	}
}